

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qocspresponse.cpp
# Opt level: O1

size_t qHash(QOcspResponse *response,size_t seed)

{
  QOcspResponsePrivate *pQVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  pQVar1 = (response->d).d.ptr;
  uVar4 = ((ulong)(long)(int)pQVar1->certificateStatus >> 0x20 ^
          (long)(int)pQVar1->certificateStatus) * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar4 >> 0x20 ^ uVar4) ^ seed;
  uVar5 = ((ulong)(long)pQVar1->revocationReason >> 0x20 ^ (long)pQVar1->revocationReason) *
          -0x2917014799a6026d;
  uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
  sVar6 = (uVar4 >> 2) + 0x9e3779b9 + uVar4 * 0x40 + (uVar5 >> 0x20 ^ uVar5) ^ uVar4;
  bVar2 = QSslCertificate::isNull(&pQVar1->signerCert);
  if (!bVar2) {
    sVar3 = qHash(&pQVar1->signerCert,0);
    sVar6 = sVar6 ^ (sVar6 >> 2) + sVar3 + sVar6 * 0x40 + 0x9e3779b9;
  }
  bVar2 = QSslCertificate::isNull(&pQVar1->subjectCert);
  if (!bVar2) {
    sVar3 = qHash(&pQVar1->subjectCert,0);
    sVar6 = sVar6 ^ (sVar6 >> 2) + sVar3 + sVar6 * 0x40 + 0x9e3779b9;
  }
  return sVar6;
}

Assistant:

size_t qHash(const QOcspResponse &response, size_t seed) noexcept
{
    const QOcspResponsePrivate *d = response.d.data();
    Q_ASSERT(d);

    QtPrivate::QHashCombine hasher;
    size_t hash = hasher(seed, int(d->certificateStatus));
    hash = hasher(hash, int(d->revocationReason));
    if (!d->signerCert.isNull())
        hash = hasher(hash, d->signerCert);
    if (!d->subjectCert.isNull())
        hash = hasher(hash, d->subjectCert);

    return hash;
}